

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
__thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
static_resources::
create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
          (static_resources *this,filter_expression *val)

{
  pointer this_00;
  unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDI;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *ptr;
  __single_object temp;
  value_type *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  filter_expression *__args;
  
  __args = (filter_expression *)&stack0xffffffffffffffe8;
  std::
  make_unique<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression,jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
            (__args);
  this_00 = std::
            unique_ptr<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression,_std::default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>_>
            ::get((unique_ptr<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression,_std::default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>_>
                   *)in_stack_ffffffffffffffa0);
  std::
  unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
  ::
  unique_ptr<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression,std::default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>,void>
            (in_RDI,(unique_ptr<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression,_std::default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>_>
                     *)__args);
  std::
  vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
  ::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(in_RDI);
  std::
  unique_ptr<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression,_std::default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>_>
  ::~unique_ptr((unique_ptr<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression,_std::default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>_>
                 *)this_00);
  return (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *)this_00;
}

Assistant:

expr_base_impl<Json>* create_expression(T&& val)
            {
                auto temp = jsoncons::make_unique<T>(std::forward<T>(val));
                expr_base_impl<Json>* ptr = temp.get();
                expr_storage_.push_back(std::move(temp));
                return ptr;
            }